

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

_Bool init_angband(void)

{
  code *pcVar1;
  long lVar2;
  
  event_signal(EVENT_ENTER_INIT);
  init_game_constants();
  lVar2 = 0;
  do {
    pcVar1 = *(code **)(*(long *)((long)modules + lVar2) + 8);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)();
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x70);
  event_signal_message(EVENT_INITSTATUS,L'\0',"Initializing other stuff...");
  monster_list_init();
  object_list_init();
  event_signal_message(EVENT_INITSTATUS,L'\0',"Getting the dice rolling...");
  Rand_init();
  return true;
}

Assistant:

bool init_angband(void)
{
	int i;

	event_signal(EVENT_ENTER_INIT);

	init_game_constants();

	/* Initialise modules */
	for (i = 0; modules[i]; i++)
		if (modules[i]->init)
			modules[i]->init();

	/* Initialize some other things */
	event_signal_message(EVENT_INITSTATUS, 0, "Initializing other stuff...");

	/* List display codes */
	monster_list_init();
	object_list_init();

	/* Initialise RNG */
	event_signal_message(EVENT_INITSTATUS, 0, "Getting the dice rolling...");
	Rand_init();

	return true;
}